

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrMesh.cpp
# Opt level: O3

ostream * amrex::operator<<(ostream *os,AmrMesh *amr_mesh)

{
  ostream *poVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"  verbose = ",0xc);
  poVar1 = (ostream *)std::ostream::operator<<(os,(amr_mesh->super_AmrInfo).verbose);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(os,"  max_level = ",0xe);
  poVar1 = (ostream *)std::ostream::operator<<(os,(amr_mesh->super_AmrInfo).max_level);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(os,"  ref_ratio =",0xd);
  if (0 < (amr_mesh->super_AmrInfo).max_level) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      operator<<(os,(IntVect *)
                    ((long)((amr_mesh->super_AmrInfo).ref_ratio.
                            super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                            super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                            _M_impl.super__Vector_impl_data._M_start)->vect + lVar3));
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0xc;
    } while (lVar4 < (amr_mesh->super_AmrInfo).max_level);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(os,"  blocking_factor =",0x13);
  if (-1 < (amr_mesh->super_AmrInfo).max_level) {
    lVar3 = -1;
    lVar4 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      operator<<(os,(IntVect *)
                    ((long)((amr_mesh->super_AmrInfo).blocking_factor.
                            super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                            super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                            _M_impl.super__Vector_impl_data._M_start)->vect + lVar4));
      lVar3 = lVar3 + 1;
      lVar4 = lVar4 + 0xc;
    } while (lVar3 < (amr_mesh->super_AmrInfo).max_level);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(os,"  max_grid_size =",0x11);
  if (-1 < (amr_mesh->super_AmrInfo).max_level) {
    lVar3 = -1;
    lVar4 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      operator<<(os,(IntVect *)
                    ((long)((amr_mesh->super_AmrInfo).max_grid_size.
                            super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                            super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                            _M_impl.super__Vector_impl_data._M_start)->vect + lVar4));
      lVar3 = lVar3 + 1;
      lVar4 = lVar4 + 0xc;
    } while (lVar3 < (amr_mesh->super_AmrInfo).max_level);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(os,"  n_error_buf =",0xf);
  if (0 < (amr_mesh->super_AmrInfo).max_level) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      operator<<(os,(IntVect *)
                    ((long)((amr_mesh->super_AmrInfo).n_error_buf.
                            super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                            super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                            _M_impl.super__Vector_impl_data._M_start)->vect + lVar3));
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0xc;
    } while (lVar4 < (amr_mesh->super_AmrInfo).max_level);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(os,"  grid_eff = ",0xd);
  poVar1 = std::ostream::_M_insert<double>((amr_mesh->super_AmrInfo).grid_eff);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(os,"  n_proper = ",0xd);
  poVar1 = (ostream *)std::ostream::operator<<(os,(amr_mesh->super_AmrInfo).n_proper);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(os,"  use_fixed_upto_level = ",0x19);
  poVar1 = (ostream *)std::ostream::operator<<(os,(amr_mesh->super_AmrInfo).use_fixed_upto_level);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(os,"  use_fixed_coarse_grids = ",0x1b);
  bVar2 = SUB81(os,0);
  poVar1 = std::ostream::_M_insert<bool>(bVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(os,"  refine_grid_layout_dims = ",0x1c);
  poVar1 = operator<<(os,&(amr_mesh->super_AmrInfo).refine_grid_layout_dims);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(os,"  check_input = ",0x10);
  poVar1 = std::ostream::_M_insert<bool>(bVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(os,"  use_new_chop = ",0x11);
  poVar1 = std::ostream::_M_insert<bool>(bVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(os,"  iterate_on_new_grids = ",0x19);
  poVar1 = std::ostream::_M_insert<bool>(bVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  return os;
}

Assistant:

std::ostream& operator<< (std::ostream& os, AmrMesh const& amr_mesh)
{
    os << "  verbose = " << amr_mesh.verbose << "\n";
    os << "  max_level = " << amr_mesh.max_level << "\n";
    os << "  ref_ratio =";
    for (int lev = 0; lev < amr_mesh.max_level; ++lev) os << " " << amr_mesh.ref_ratio[lev];
    os << "\n";
    os << "  blocking_factor =";
    for (int lev = 0; lev <= amr_mesh.max_level; ++lev) os << " " << amr_mesh.blocking_factor[lev];
    os << "\n";
    os << "  max_grid_size =";
    for (int lev = 0; lev <= amr_mesh.max_level; ++lev) os << " " << amr_mesh.max_grid_size[lev];
    os << "\n";
    os << "  n_error_buf =";
    for (int lev = 0; lev < amr_mesh.max_level; ++lev) os << " " << amr_mesh.n_error_buf[lev];
    os << "\n";
    os << "  grid_eff = " << amr_mesh.grid_eff << "\n";
    os << "  n_proper = " << amr_mesh.n_proper << "\n";
    os << "  use_fixed_upto_level = " << amr_mesh.use_fixed_upto_level << "\n";
    os << "  use_fixed_coarse_grids = " << amr_mesh.use_fixed_coarse_grids << "\n";
    os << "  refine_grid_layout_dims = " << amr_mesh.refine_grid_layout_dims << "\n";
    os << "  check_input = " << amr_mesh.check_input  << "\n";
    os << "  use_new_chop = " << amr_mesh.use_new_chop << "\n";
    os << "  iterate_on_new_grids = " << amr_mesh.iterate_on_new_grids << "\n";
    return os;
}